

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall rest_rpc::rpc_client::rpc_client(rpc_client *this)

{
  noncopyable *__n;
  noncopyable *in_RDI;
  noncopyable *__args;
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  function<void_(std::error_code)> *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff40;
  io_context *in_stack_ffffffffffffff50;
  vector<char,_std::allocator<char>_> *this_01;
  io_context *in_stack_ffffffffffffff58;
  noncopyable *local_88;
  
  asio::detail::noncopyable::noncopyable(in_RDI);
  asio::io_context::io_context(in_stack_ffffffffffffff50);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffff30,
             (io_context *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),0);
  std::make_shared<asio::io_context::work,asio::io_context&>(in_stack_ffffffffffffff58);
  std::shared_ptr<std::thread>::shared_ptr
            ((shared_ptr<std::thread> *)in_stack_ffffffffffffff30,
             (nullptr_t)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::__cxx11::string::string((string *)(in_RDI + 0x90));
  *(undefined2 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 1000;
  *(undefined4 *)(in_RDI + 0xc0) = 0xffffffff;
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  std::mutex::mutex((mutex *)0x244486);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0xf0));
  in_RDI[0x120] = (noncopyable)0x0;
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer<asio::io_context>
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              *)in_stack_ffffffffffffff30,
             (io_context *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),0);
  in_RDI[0x1a0] = (noncopyable)0x0;
  std::
  deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ::deque((deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
           *)0x2444ef);
  *(undefined4 *)(in_RDI + 0x1f8) = 0;
  std::mutex::mutex((mutex *)0x24450f);
  *(undefined8 *)(in_RDI + 0x228) = 0;
  __args = in_RDI + 0x230;
  std::function<void_(std::error_code)>::function(in_stack_ffffffffffffff30);
  in_RDI[0x250] = (noncopyable)0x0;
  std::
  unordered_map<unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>_>_>
                   *)0x244553);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>_>_>
                   *)0x24456c);
  std::mutex::mutex((mutex *)0x244580);
  *(undefined8 *)(in_RDI + 0x2f0) = 0;
  *(undefined8 *)(in_RDI + 0x2f8) = 0;
  local_88 = in_RDI + 0x300;
  do {
    *local_88 = (noncopyable)0x0;
    local_88 = local_88 + 1;
  } while (local_88 != in_RDI + 0x314);
  __n = in_RDI + 0x318;
  this_01 = (vector<char,_std::allocator<char>_> *)&stack0xffffffffffffffeb;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(this_01,(size_type)__n,in_stack_ffffffffffffff40)
  ;
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffeb);
  this_00 = (function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)(in_RDI + 0x348);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                   *)0x244631);
  std::
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x24464a);
  *(undefined4 *)(in_RDI + 0x3b0) = 0;
  std::
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this_00);
  std::make_shared<std::thread,rest_rpc::rpc_client::rpc_client()::_lambda()_1_>((type *)__args);
  std::shared_ptr<std::thread>::operator=
            ((shared_ptr<std::thread> *)this_00,
             (shared_ptr<std::thread> *)
             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x2446bd);
  return;
}

Assistant:

rpc_client()
      : socket_(ios_), work_(std::make_shared<asio::io_context::work>(ios_)),
        deadline_(ios_), body_(INIT_BUF_SIZE) {
    thd_ = std::make_shared<std::thread>([this] { ios_.run(); });
  }